

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::OutputLinkLibraries
          (cmLocalGenerator *this,string *linkLibraries,string *frameworkPath,string *linkPath,
          cmGeneratorTarget *tgt,bool relink,bool forResponseFile,bool useWatcomQuote)

{
  cmMakefile *pcVar1;
  bool bVar2;
  TargetType TVar3;
  PolicyStatus PVar4;
  char *pcVar5;
  cmComputeLinkInformation *this_00;
  cmState *this_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar6;
  cmOutputConverter *this_02;
  ItemVector *pIVar7;
  ostream *poVar8;
  OutputFormat output;
  PolicyID id;
  PolicyID id_00;
  pointer pbVar9;
  pointer pIVar10;
  string rpath_link;
  string standardLibsVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  runtimeDirs;
  string linkLibs;
  string linkLanguage;
  string libPathTerminator;
  string libPathFlag;
  string config;
  string fwSearchFlagVar;
  ostringstream fout;
  
  output = RESPONSE;
  if (!forResponseFile) {
    output = useWatcomQuote | SHELL;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&fout);
  pcVar1 = this->Makefile;
  std::__cxx11::string::string((string *)&fwSearchFlagVar,"CMAKE_BUILD_TYPE",(allocator *)&linkLibs)
  ;
  pcVar5 = cmMakefile::GetSafeDefinition(pcVar1,&fwSearchFlagVar);
  std::__cxx11::string::string((string *)&config,pcVar5,(allocator *)&linkLanguage);
  std::__cxx11::string::~string((string *)&fwSearchFlagVar);
  this_00 = cmGeneratorTarget::GetLinkInformation(tgt,&config);
  if (this_00 == (cmComputeLinkInformation *)0x0) goto LAB_00337713;
  linkLibs._M_dataplus._M_p = (pointer)&linkLibs.field_2;
  linkLibs._M_string_length = 0;
  linkLibs.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&linkLanguage,(string *)&this_00->LinkLanguage);
  pcVar1 = this->Makefile;
  std::__cxx11::string::string
            ((string *)&fwSearchFlagVar,"CMAKE_LIBRARY_PATH_FLAG",(allocator *)&libPathTerminator);
  pcVar5 = cmMakefile::GetRequiredDefinition(pcVar1,&fwSearchFlagVar);
  std::__cxx11::string::string((string *)&libPathFlag,pcVar5,(allocator *)&rpath_link);
  std::__cxx11::string::~string((string *)&fwSearchFlagVar);
  pcVar1 = this->Makefile;
  std::__cxx11::string::string
            ((string *)&fwSearchFlagVar,"CMAKE_LIBRARY_PATH_TERMINATOR",(allocator *)&rpath_link);
  pcVar5 = cmMakefile::GetSafeDefinition(pcVar1,&fwSearchFlagVar);
  std::__cxx11::string::string((string *)&libPathTerminator,pcVar5,(allocator *)&standardLibsVar);
  std::__cxx11::string::~string((string *)&fwSearchFlagVar);
  TVar3 = cmGeneratorTarget::GetType(tgt);
  if (TVar3 != EXECUTABLE) goto switchD_00336fc1_default;
  this_01 = cmState::Snapshot::GetState(&this->StateSnapshot);
  std::__cxx11::string::string
            ((string *)&fwSearchFlagVar,"TARGET_SUPPORTS_SHARED_LIBS",(allocator *)&rpath_link);
  bVar2 = cmState::GetGlobalPropertyAsBool(this_01,&fwSearchFlagVar);
  std::__cxx11::string::~string((string *)&fwSearchFlagVar);
  if (!bVar2) goto switchD_00336fc1_default;
  PVar4 = cmGeneratorTarget::GetPolicyStatusCMP0065(tgt);
  switch(PVar4) {
  case WARN:
    std::__cxx11::string::string
              ((string *)&fwSearchFlagVar,"ENABLE_EXPORTS",(allocator *)&standardLibsVar);
    bVar2 = cmGeneratorTarget::GetPropertyAsBool(tgt,&fwSearchFlagVar);
    if (bVar2) {
      std::__cxx11::string::~string((string *)&fwSearchFlagVar);
    }
    else {
      pcVar1 = this->Makefile;
      std::__cxx11::string::string
                ((string *)&rpath_link,"CMAKE_POLICY_WARNING_CMP0065",(allocator *)&runtimeDirs);
      bVar2 = cmMakefile::PolicyOptionalWarningEnabled(pcVar1,&rpath_link);
      std::__cxx11::string::~string((string *)&rpath_link);
      std::__cxx11::string::~string((string *)&fwSearchFlagVar);
      if (bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&fwSearchFlagVar);
        cmPolicies::GetPolicyWarning_abi_cxx11_(&rpath_link,(cmPolicies *)0x41,id_00);
        poVar8 = std::operator<<((ostream *)&fwSearchFlagVar,(string *)&rpath_link);
        std::operator<<(poVar8,
                        "\nFor compatibility with older versions of CMake, additional flags may be added to export symbols on all executables regardless of thier ENABLE_EXPORTS property."
                       );
        std::__cxx11::string::~string((string *)&rpath_link);
        pcVar1 = this->Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&rpath_link,false);
        std::__cxx11::string::~string((string *)&rpath_link);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fwSearchFlagVar);
      }
    }
  case OLD:
switchD_00336fc1_caseD_0:
    std::__cxx11::string::string
              ((string *)&fwSearchFlagVar,"CMAKE_SHARED_LIBRARY_LINK_",(allocator *)&rpath_link);
    std::__cxx11::string::append((string *)&fwSearchFlagVar);
    std::__cxx11::string::append((char *)&fwSearchFlagVar);
    cmMakefile::GetSafeDefinition(this->Makefile,&fwSearchFlagVar);
    std::__cxx11::string::assign((char *)&linkLibs);
    std::__cxx11::string::append((char *)&linkLibs);
    std::__cxx11::string::~string((string *)&fwSearchFlagVar);
    break;
  case NEW:
    goto switchD_00336fc1_caseD_2;
  case REQUIRED_IF_USED:
  case REQUIRED_ALWAYS:
    pcVar1 = this->Makefile;
    cmPolicies::GetRequiredPolicyError_abi_cxx11_(&fwSearchFlagVar,(cmPolicies *)0x41,id);
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&fwSearchFlagVar,false);
    std::__cxx11::string::~string((string *)&fwSearchFlagVar);
switchD_00336fc1_caseD_2:
    std::__cxx11::string::string
              ((string *)&fwSearchFlagVar,"ENABLE_EXPORTS",(allocator *)&rpath_link);
    bVar2 = cmGeneratorTarget::GetPropertyAsBool(tgt,&fwSearchFlagVar);
    std::__cxx11::string::~string((string *)&fwSearchFlagVar);
    if (bVar2) goto switchD_00336fc1_caseD_0;
    break;
  default:
    break;
  }
switchD_00336fc1_default:
  std::__cxx11::string::string((string *)&fwSearchFlagVar,"CMAKE_",(allocator *)&rpath_link);
  std::__cxx11::string::append((string *)&fwSearchFlagVar);
  std::__cxx11::string::append((char *)&fwSearchFlagVar);
  pcVar5 = cmMakefile::GetDefinition(this->Makefile,&fwSearchFlagVar);
  if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
    pvVar6 = cmComputeLinkInformation::GetFrameworkPaths_abi_cxx11_(this_00);
    for (pbVar9 = (pvVar6->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pbVar9 != (pvVar6->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish; pbVar9 = pbVar9 + 1) {
      std::__cxx11::string::append((char *)frameworkPath);
      cmOutputConverter::Convert(&rpath_link,&this->super_cmOutputConverter,pbVar9,NONE,output);
      std::__cxx11::string::append((string *)frameworkPath);
      std::__cxx11::string::~string((string *)&rpath_link);
      std::__cxx11::string::append((char *)frameworkPath);
    }
  }
  pvVar6 = cmComputeLinkInformation::GetDirectories_abi_cxx11_(this_00);
  this_02 = &this->super_cmOutputConverter;
  for (pbVar9 = (pvVar6->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pbVar9 != (pvVar6->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish; pbVar9 = pbVar9 + 1) {
    cmOutputConverter::ConvertToOutputForExisting(&rpath_link,this_02,pbVar9,START_OUTPUT,output);
    std::operator+(&standardLibsVar," ",&libPathFlag);
    std::__cxx11::string::append((string *)linkPath);
    std::__cxx11::string::~string((string *)&standardLibsVar);
    std::__cxx11::string::append((string *)linkPath);
    std::__cxx11::string::append((string *)linkPath);
    std::__cxx11::string::append((char *)linkPath);
    std::__cxx11::string::~string((string *)&rpath_link);
  }
  pIVar7 = cmComputeLinkInformation::GetItems(this_00);
  for (pIVar10 = (pIVar7->
                 super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      pIVar10 !=
      (pIVar7->
      super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
      )._M_impl.super__Vector_impl_data._M_finish; pIVar10 = pIVar10 + 1) {
    if ((pIVar10->Target == (cmGeneratorTarget *)0x0) ||
       (TVar3 = cmGeneratorTarget::GetType(pIVar10->Target), TVar3 != INTERFACE_LIBRARY)) {
      if (pIVar10->IsPath == true) {
        (*this->_vptr_cmLocalGenerator[0xd])(&rpath_link,this,pIVar10);
        std::__cxx11::string::append((string *)&linkLibs);
        std::__cxx11::string::~string((string *)&rpath_link);
      }
      else {
        std::__cxx11::string::append((string *)&linkLibs);
      }
      std::__cxx11::string::append((char *)&linkLibs);
    }
  }
  std::operator<<((ostream *)&fout,(string *)&linkLibs);
  if ((this_00->RuntimeSep)._M_string_length == 0) {
    runtimeDirs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    runtimeDirs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    runtimeDirs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmComputeLinkInformation::GetRPath(this_00,&runtimeDirs,relink);
    rpath_link._M_dataplus._M_p = (pointer)&rpath_link.field_2;
    rpath_link._M_string_length = 0;
    rpath_link.field_2._M_local_buf[0] = '\0';
    for (pbVar9 = runtimeDirs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar9 != runtimeDirs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar9 = pbVar9 + 1) {
      std::__cxx11::string::append((string *)&rpath_link);
      cmOutputConverter::Convert(&standardLibsVar,this_02,pbVar9,NONE,output);
      std::__cxx11::string::append((string *)&rpath_link);
      std::__cxx11::string::~string((string *)&standardLibsVar);
      std::__cxx11::string::append((char *)&rpath_link);
    }
    std::operator<<((ostream *)&fout,(string *)&rpath_link);
    std::__cxx11::string::~string((string *)&rpath_link);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&runtimeDirs);
  }
  else {
    cmComputeLinkInformation::GetRPathString_abi_cxx11_(&rpath_link,this_00,relink);
    if (rpath_link._M_string_length != 0) {
      std::operator<<((ostream *)&fout,(string *)&this_00->RuntimeFlag);
      cmOutputConverter::EscapeForShell
                (&standardLibsVar,this_02,&rpath_link,!forResponseFile,false,false);
      std::operator<<((ostream *)&fout,(string *)&standardLibsVar);
      std::__cxx11::string::~string((string *)&standardLibsVar);
      std::operator<<((ostream *)&fout," ");
    }
    std::__cxx11::string::~string((string *)&rpath_link);
  }
  cmComputeLinkInformation::GetRPathLinkString_abi_cxx11_(&rpath_link,this_00);
  if (((this_00->RPathLinkFlag)._M_string_length != 0) && (rpath_link._M_string_length != 0)) {
    std::operator<<((ostream *)&fout,(string *)&this_00->RPathLinkFlag);
    cmOutputConverter::EscapeForShell
              (&standardLibsVar,this_02,&rpath_link,!forResponseFile,false,false);
    std::operator<<((ostream *)&fout,(string *)&standardLibsVar);
    std::__cxx11::string::~string((string *)&standardLibsVar);
    std::operator<<((ostream *)&fout," ");
  }
  std::__cxx11::string::string((string *)&standardLibsVar,"CMAKE_",(allocator *)&runtimeDirs);
  std::__cxx11::string::string((string *)&runtimeDirs,(string *)&this_00->LinkLanguage);
  std::__cxx11::string::append((string *)&standardLibsVar);
  std::__cxx11::string::~string((string *)&runtimeDirs);
  std::__cxx11::string::append((char *)&standardLibsVar);
  pcVar5 = cmMakefile::GetDefinition(this->Makefile,&standardLibsVar);
  if (pcVar5 != (char *)0x0) {
    poVar8 = std::operator<<((ostream *)&fout,pcVar5);
    std::operator<<(poVar8," ");
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)linkLibraries,(string *)&runtimeDirs);
  std::__cxx11::string::~string((string *)&runtimeDirs);
  std::__cxx11::string::~string((string *)&standardLibsVar);
  std::__cxx11::string::~string((string *)&rpath_link);
  std::__cxx11::string::~string((string *)&fwSearchFlagVar);
  std::__cxx11::string::~string((string *)&libPathTerminator);
  std::__cxx11::string::~string((string *)&libPathFlag);
  std::__cxx11::string::~string((string *)&linkLanguage);
  std::__cxx11::string::~string((string *)&linkLibs);
LAB_00337713:
  std::__cxx11::string::~string((string *)&config);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fout);
  return;
}

Assistant:

void cmLocalGenerator::OutputLinkLibraries(std::string& linkLibraries,
                                           std::string& frameworkPath,
                                           std::string& linkPath,
                                           cmGeneratorTarget &tgt,
                                           bool relink,
                                           bool forResponseFile,
                                           bool useWatcomQuote)
{
  OutputFormat shellFormat = (forResponseFile) ? RESPONSE :
                             ((useWatcomQuote) ? WATCOMQUOTE : SHELL);
  bool escapeAllowMakeVars = !forResponseFile;
  std::ostringstream fout;
  std::string config = this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");
  cmComputeLinkInformation* pcli = tgt.GetLinkInformation(config);
  if(!pcli)
    {
    return;
    }
  cmComputeLinkInformation& cli = *pcli;

  // Collect library linking flags command line options.
  std::string linkLibs;

  std::string linkLanguage = cli.GetLinkLanguage();

  std::string libPathFlag =
    this->Makefile->GetRequiredDefinition("CMAKE_LIBRARY_PATH_FLAG");
  std::string libPathTerminator =
    this->Makefile->GetSafeDefinition("CMAKE_LIBRARY_PATH_TERMINATOR");

  // Flags to link an executable to shared libraries.
  if (tgt.GetType() == cmState::EXECUTABLE &&
      this->StateSnapshot.GetState()->
        GetGlobalPropertyAsBool("TARGET_SUPPORTS_SHARED_LIBS"))
    {
    bool add_shlib_flags = false;
    switch(tgt.GetPolicyStatusCMP0065())
      {
      case cmPolicies::WARN:
        if(!tgt.GetPropertyAsBool("ENABLE_EXPORTS") &&
           this->Makefile->PolicyOptionalWarningEnabled(
             "CMAKE_POLICY_WARNING_CMP0065"))
          {
          std::ostringstream w;
          w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0065) << "\n"
            "For compatibility with older versions of CMake, "
            "additional flags may be added to export symbols on all "
            "executables regardless of thier ENABLE_EXPORTS property.";
          this->Makefile->IssueMessage(cmake::AUTHOR_WARNING, w.str());
          }
      case cmPolicies::OLD:
        // OLD behavior is to always add the flags
        add_shlib_flags = true;
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        this->Makefile->IssueMessage(
          cmake::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0065)
          );
      case cmPolicies::NEW:
        // NEW behavior is to only add the flags if ENABLE_EXPORTS is on
        add_shlib_flags = tgt.GetPropertyAsBool("ENABLE_EXPORTS");
        break;
      }

    if(add_shlib_flags)
      {
      std::string linkFlagsVar = "CMAKE_SHARED_LIBRARY_LINK_";
      linkFlagsVar += linkLanguage;
      linkFlagsVar += "_FLAGS";
      linkLibs = this->Makefile->GetSafeDefinition(linkFlagsVar);
      linkLibs += " ";
      }
    }

  // Append the framework search path flags.
  std::string fwSearchFlagVar = "CMAKE_";
  fwSearchFlagVar += linkLanguage;
  fwSearchFlagVar += "_FRAMEWORK_SEARCH_FLAG";
  const char* fwSearchFlag =
    this->Makefile->GetDefinition(fwSearchFlagVar);
  if(fwSearchFlag && *fwSearchFlag)
    {
    std::vector<std::string> const& fwDirs = cli.GetFrameworkPaths();
    for(std::vector<std::string>::const_iterator fdi = fwDirs.begin();
        fdi != fwDirs.end(); ++fdi)
      {
      frameworkPath += fwSearchFlag;
      frameworkPath += this->Convert(*fdi, NONE, shellFormat);
      frameworkPath += " ";
      }
    }

  // Append the library search path flags.
  std::vector<std::string> const& libDirs = cli.GetDirectories();
  for(std::vector<std::string>::const_iterator libDir = libDirs.begin();
      libDir != libDirs.end(); ++libDir)
    {
    std::string libpath = this->ConvertToOutputForExisting(*libDir,
                                                           START_OUTPUT,
                                                           shellFormat);
    linkPath += " " + libPathFlag;
    linkPath += libpath;
    linkPath += libPathTerminator;
    linkPath += " ";
    }

  // Append the link items.
  typedef cmComputeLinkInformation::ItemVector ItemVector;
  ItemVector const& items = cli.GetItems();
  for(ItemVector::const_iterator li = items.begin(); li != items.end(); ++li)
    {
    if(li->Target && li->Target->GetType() == cmState::INTERFACE_LIBRARY)
      {
      continue;
      }
    if(li->IsPath)
      {
      linkLibs += this->ConvertToLinkReference(li->Value, shellFormat);
      }
    else
      {
      linkLibs += li->Value;
      }
    linkLibs += " ";
    }

  // Write the library flags to the build rule.
  fout << linkLibs;

  // Check what kind of rpath flags to use.
  if(cli.GetRuntimeSep().empty())
    {
    // Each rpath entry gets its own option ("-R a -R b -R c")
    std::vector<std::string> runtimeDirs;
    cli.GetRPath(runtimeDirs, relink);

    std::string rpath;
    for(std::vector<std::string>::iterator ri = runtimeDirs.begin();
        ri != runtimeDirs.end(); ++ri)
      {
      rpath += cli.GetRuntimeFlag();
      rpath += this->Convert(*ri, NONE, shellFormat);
      rpath += " ";
      }
    fout << rpath;
    }
  else
    {
    // All rpath entries are combined ("-Wl,-rpath,a:b:c").
    std::string rpath = cli.GetRPathString(relink);

    // Store the rpath option in the stream.
    if(!rpath.empty())
      {
      fout << cli.GetRuntimeFlag();
      fout << this->EscapeForShell(rpath, escapeAllowMakeVars);
      fout << " ";
      }
    }

  // Add the linker runtime search path if any.
  std::string rpath_link = cli.GetRPathLinkString();
  if(!cli.GetRPathLinkFlag().empty() && !rpath_link.empty())
    {
    fout << cli.GetRPathLinkFlag();
    fout << this->EscapeForShell(rpath_link, escapeAllowMakeVars);
    fout << " ";
    }

  // Add standard libraries for this language.
  std::string standardLibsVar = "CMAKE_";
  standardLibsVar += cli.GetLinkLanguage();
  standardLibsVar += "_STANDARD_LIBRARIES";
  if(const char* stdLibs =
     this->Makefile->GetDefinition(standardLibsVar))
    {
    fout << stdLibs << " ";
    }

  linkLibraries = fout.str();
}